

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O3

void * lj_ccallback_new(CTState *cts,CType *ct,GCfunc *fn)

{
  uint uVar1;
  CType *pCVar2;
  global_State *pgVar3;
  GCtab *t;
  uint64_t uVar4;
  undefined8 *start;
  CTypeID1 *p;
  TValue *pTVar5;
  undefined8 *puVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  ushort uVar10;
  undefined8 *puVar11;
  undefined1 uVar12;
  uint uVar13;
  uint uVar14;
  GCobj *o;
  ulong uVar15;
  
  uVar1 = ct->info;
  if (((uVar1 & 0xf0000000) == 0x20000000) && (ct->size == 8)) {
    pCVar2 = cts->tab;
    uVar14 = pCVar2[(ulong)uVar1 & 0xffff].info;
    if ((uVar14 & 0xf0000000) == 0x60000000) {
      uVar10 = pCVar2[(ulong)uVar1 & 0xffff].sib;
      uVar13 = pCVar2[(ulong)uVar14 & 0xffff].info >> 0x1c;
      if ((uVar13 < 6) && ((0x34U >> uVar13 & 1) != 0)) {
        if ((uVar14 >> 0x17 & 1) != 0) {
          return (void *)0x0;
        }
      }
      else {
        if (0xfffffff < pCVar2[(ulong)uVar14 & 0xffff].info) {
          return (void *)0x0;
        }
        if ((uVar14 >> 0x17 & 1) != 0) {
          return (void *)0x0;
        }
        if (8 < pCVar2[(ulong)uVar14 & 0xffff].size) {
          return (void *)0x0;
        }
      }
      if (uVar10 != 0) {
        iVar8 = 0;
        do {
          uVar15 = (ulong)pCVar2[uVar10].info & 0xffff;
          uVar14 = pCVar2[uVar15].info >> 0x1c;
          if ((uVar14 != 2) && (uVar14 != 5)) {
            if (0xfffffff < pCVar2[uVar15].info) {
              return (void *)0x0;
            }
            if (8 < pCVar2[uVar15].size) {
              return (void *)0x0;
            }
          }
          if (0xf < iVar8) {
            return (void *)0x0;
          }
          iVar8 = iVar8 + 1;
          uVar10 = pCVar2[uVar10].sib;
        } while (uVar10 != 0);
      }
      p = (cts->cb).cbid;
      uVar14 = (cts->cb).topid;
      uVar9 = (ulong)uVar14;
      uVar13 = (cts->cb).sizeid;
      iVar8 = uVar13 - uVar14;
      uVar15 = uVar9;
      if (uVar14 <= uVar13 && iVar8 != 0) {
        do {
          if (p[uVar15] == 0) {
            uVar9 = uVar15 & 0xffffffff;
            goto LAB_001432a3;
          }
          uVar15 = uVar15 + 1;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        uVar9 = (ulong)uVar13;
      }
      if (0x37f < (uint)uVar9) {
LAB_0014332f:
        lj_err_caller(cts->L,LJ_ERR_FFI_CBACKOV);
      }
      if ((cts->cb).mcode == (void *)0x0) {
        uVar14 = 0;
        start = (undefined8 *)mmap64((void *)0x0,0x1000,3,0x22,-1,0);
        if (start == (undefined8 *)0xffffffffffffffff) goto LAB_0014332f;
        (cts->cb).mcode = start;
        pgVar3 = cts->g;
        *start = lj_vm_ffi_callback;
        puVar6 = start + 1;
        do {
          *(undefined1 *)puVar6 = 0xb0;
          *(char *)((long)puVar6 + 1) = (char)uVar14;
          if ((uVar14 & 0x1f) == 0x1f) {
            *(char *)((long)puVar6 + 4) = (char)(uVar14 >> 8);
            *(undefined2 *)((long)puVar6 + 5) = 0xbd48;
            *(global_State **)((long)puVar6 + 7) = pgVar3;
            *(undefined2 *)((long)puVar6 + 0xf) = 0x25ff;
            puVar11 = (undefined8 *)((long)puVar6 + 0x15);
            *(int *)((long)puVar6 + 0x11) = (int)start - (int)puVar11;
            cVar7 = -0x4c;
            uVar12 = 0x55;
          }
          else {
            cVar7 = ((char)(uVar14 & 0x1f) << 2 ^ 0x7cU) - 2;
            puVar11 = (undefined8 *)((long)puVar6 + 4);
            uVar12 = 0xeb;
          }
          *(undefined1 *)((long)puVar6 + 2) = uVar12;
          *(char *)((long)puVar6 + 3) = cVar7;
          uVar14 = uVar14 + 1;
          puVar6 = puVar11;
        } while (uVar14 != 0x380);
        lj_mcode_sync(start,start + 0x200);
        mprotect(start,0x1000,5);
      }
      p = (CTypeID1 *)lj_mem_grow(cts->L,p,&(cts->cb).sizeid,0x380,2);
      (cts->cb).cbid = p;
      memset(p + uVar9,0,(ulong)((cts->cb).sizeid - (uint)uVar9) * 2);
      uVar15 = uVar9;
LAB_001432a3:
      p[uVar9] = (CTypeID1)uVar1;
      uVar1 = (uint)uVar15;
      (cts->cb).topid = uVar1 + 1;
      t = cts->miscmap;
      if (uVar1 < t->asize) {
        pTVar5 = (TValue *)((long)(int)uVar1 * 8 + (t->array).ptr64);
      }
      else {
        pTVar5 = lj_tab_setinth(cts->L,t,uVar1);
      }
      pTVar5->u64 = (ulong)fn | 0xfffb800000000000;
      if ((t->marked & 4) != 0) {
        uVar4 = (cts->L->glref).ptr64;
        t->marked = t->marked & 0xfb;
        (t->gclist).gcptr64 = *(uint64_t *)(uVar4 + 0x40);
        *(GCtab **)(uVar4 + 0x40) = t;
      }
      return (void *)((ulong)(((uint)(uVar15 >> 5) & 0x7ffffff) * 0x11 + uVar1 * 4 + 8) +
                     (long)(cts->cb).mcode);
    }
  }
  return (void *)0x0;
}

Assistant:

void *lj_ccallback_new(CTState *cts, CType *ct, GCfunc *fn)
{
  ct = callback_checkfunc(cts, ct);
  if (ct) {
    MSize slot = callback_slot_new(cts, ct);
    GCtab *t = cts->miscmap;
    setfuncV(cts->L, lj_tab_setint(cts->L, t, (int32_t)slot), fn);
    lj_gc_anybarriert(cts->L, t);
    return callback_slot2ptr(cts, slot);
  }
  return NULL;  /* Bad conversion. */
}